

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslScanContext.cpp
# Opt level: O0

EHlslTokenClass __thiscall
glslang::HlslScanContext::tokenizeClass(HlslScanContext *this,HlslToken *token)

{
  HlslToken *pHVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  anon_union_8_5_54ae9b2d_for_HlslToken_2 aVar5;
  anon_union_8_5_54ae9b2d_for_HlslToken_2 aVar6;
  anon_union_8_5_54ae9b2d_for_HlslToken_2 aVar7;
  EHlslTokenClass EVar8;
  TString *pTVar9;
  undefined1 local_45a;
  undefined1 local_459;
  int iStack_454;
  char buf [2];
  EHlslTokenClass token_2;
  int token_1;
  TPpToken ppToken;
  HlslToken *token_local;
  HlslScanContext *this_local;
  
  ppToken._1064_8_ = token;
  while( true ) {
    this->parserToken = (HlslToken *)ppToken._1064_8_;
    TPpToken::TPpToken((TPpToken *)&token_2);
    iStack_454 = TPpContext::tokenize(this->ppContext,(TPpToken *)&token_2);
    if (iStack_454 == -1) break;
    this->tokenText = (char *)&ppToken.field_3;
    (this->loc).column = ppToken.loc.string;
    *(int *)&(this->loc).field_0x14 = ppToken.loc.line;
    (this->loc).name = _token_2;
    *(TString **)&(this->loc).string = ppToken.loc.name;
    pHVar1 = this->parserToken;
    uVar2 = *(undefined4 *)&(this->loc).field_0x14;
    (pHVar1->loc).column = (this->loc).column;
    *(undefined4 *)&(pHVar1->loc).field_0x14 = uVar2;
    uVar2 = *(undefined4 *)((long)&(this->loc).name + 4);
    iVar3 = (this->loc).string;
    iVar4 = (this->loc).line;
    *(undefined4 *)&(pHVar1->loc).name = *(undefined4 *)&(this->loc).name;
    *(undefined4 *)((long)&(pHVar1->loc).name + 4) = uVar2;
    (pHVar1->loc).string = iVar3;
    (pHVar1->loc).line = iVar4;
    switch(iStack_454) {
    default:
      if (iStack_454 < 0x7f) {
        local_45a = (undefined1)iStack_454;
        local_459 = 0;
        (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2d])
                  (this->parseContext,&this->loc,"unexpected token",&local_45a,"");
      }
      else if (*this->tokenText == '\0') {
        (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2d])
                  (this->parseContext,&this->loc,"unexpected token","");
      }
      else {
        (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2d])
                  (this->parseContext,&this->loc,"unexpected token",this->tokenText,"");
      }
      break;
    case 0x21:
      return EHTokBang;
    case 0x25:
      return EHTokPercent;
    case 0x26:
      return EHTokAmpersand;
    case 0x28:
      return EHTokLeftParen;
    case 0x29:
      return EHTokRightParen;
    case 0x2a:
      return EHTokStar;
    case 0x2b:
      return EHTokPlus;
    case 0x2c:
      return EHTokComma;
    case 0x2d:
      return EHTokDash;
    case 0x2e:
      return EHTokDot;
    case 0x2f:
      return EHTokSlash;
    case 0x3a:
      return EHTokColon;
    case 0x3b:
      return EHTokSemicolon;
    case 0x3c:
      return EHTokLeftAngle;
    case 0x3d:
      return EHTokAssign;
    case 0x3e:
      return EHTokRightAngle;
    case 0x3f:
      return EHTokQuestion;
    case 0x5b:
      return EHTokLeftBracket;
    case 0x5c:
      (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2d])
                (this->parseContext,&this->loc,"illegal use of escape character","\\","");
      break;
    case 0x5d:
      return EHTokRightBracket;
    case 0x5e:
      return EHTokCaret;
    case 0x7b:
      return EHTokLeftBrace;
    case 0x7c:
      return EHTokVerticalBar;
    case 0x7d:
      return EHTokRightBrace;
    case 0x7e:
      return EHTokTilde;
    case 0x81:
      return EHTokAddAssign;
    case 0x82:
      return EHTokSubAssign;
    case 0x83:
      return EHTokMulAssign;
    case 0x84:
      return EHTokDivAssign;
    case 0x85:
      return EHTokModAssign;
    case 0x86:
      return EHTokRightOp;
    case 0x87:
      return EHTokLeftOp;
    case 0x88:
      return EHTokRightAssign;
    case 0x89:
      return EHTokLeftAssign;
    case 0x8a:
      return EHTokAndAssign;
    case 0x8b:
      return EHTokOrAssign;
    case 0x8c:
      return EHTokXorAssign;
    case 0x8d:
      return EHTokAndOp;
    case 0x8e:
      return EHTokOrOp;
    case 0x8f:
      return EHTokXorOp;
    case 0x90:
      return EHTokEqOp;
    case 0x91:
      return EHTokNeOp;
    case 0x92:
      return EHTokGeOp;
    case 0x93:
      return EHTokLeOp;
    case 0x94:
      return EHTokDecOp;
    case 0x95:
      return EHTokIncOp;
    case 0x96:
      return EHTokColonColon;
    case 0x98:
      (this->parserToken->field_2).i = ppToken._24_4_;
      return EHTokIntConstant;
    case 0x99:
      (this->parserToken->field_2).i = ppToken._24_4_;
      return EHTokUintConstant;
    case 0x9e:
      aVar6._4_4_ = ppToken._28_4_;
      aVar6._0_1_ = ppToken.space;
      aVar6._1_1_ = ppToken.fullyExpanded;
      aVar6._2_2_ = ppToken._26_2_;
      this->parserToken->field_2 = aVar6;
      return EHTokFloatConstant;
    case 0x9f:
      aVar7._4_4_ = ppToken._28_4_;
      aVar7._0_1_ = ppToken.space;
      aVar7._1_1_ = ppToken.fullyExpanded;
      aVar7._2_2_ = ppToken._26_2_;
      this->parserToken->field_2 = aVar7;
      return EHTokDoubleConstant;
    case 0xa0:
      aVar5._4_4_ = ppToken._28_4_;
      aVar5._0_1_ = ppToken.space;
      aVar5._1_1_ = ppToken.fullyExpanded;
      aVar5._2_2_ = ppToken._26_2_;
      this->parserToken->field_2 = aVar5;
      return EHTokFloat16Constant;
    case 0xa1:
      pTVar9 = NewPoolTString_abi_cxx11_(this->tokenText);
      (this->parserToken->field_2).string = pTVar9;
      return EHTokStringConstant;
    case 0xa2:
      EVar8 = tokenizeIdentifier(this);
      return EVar8;
    }
  }
  return EHTokNone;
}

Assistant:

EHlslTokenClass HlslScanContext::tokenizeClass(HlslToken& token)
{
    do {
        parserToken = &token;
        TPpToken ppToken;
        int token = ppContext.tokenize(ppToken);
        if (token == EndOfInput)
            return EHTokNone;

        tokenText = ppToken.name;
        loc = ppToken.loc;
        parserToken->loc = loc;
        switch (token) {
        case ';':                       return EHTokSemicolon;
        case ',':                       return EHTokComma;
        case ':':                       return EHTokColon;
        case '=':                       return EHTokAssign;
        case '(':                       return EHTokLeftParen;
        case ')':                       return EHTokRightParen;
        case '.':                       return EHTokDot;
        case '!':                       return EHTokBang;
        case '-':                       return EHTokDash;
        case '~':                       return EHTokTilde;
        case '+':                       return EHTokPlus;
        case '*':                       return EHTokStar;
        case '/':                       return EHTokSlash;
        case '%':                       return EHTokPercent;
        case '<':                       return EHTokLeftAngle;
        case '>':                       return EHTokRightAngle;
        case '|':                       return EHTokVerticalBar;
        case '^':                       return EHTokCaret;
        case '&':                       return EHTokAmpersand;
        case '?':                       return EHTokQuestion;
        case '[':                       return EHTokLeftBracket;
        case ']':                       return EHTokRightBracket;
        case '{':                       return EHTokLeftBrace;
        case '}':                       return EHTokRightBrace;
        case '\\':
            parseContext.error(loc, "illegal use of escape character", "\\", "");
            break;

        case PPAtomAddAssign:          return EHTokAddAssign;
        case PPAtomSubAssign:          return EHTokSubAssign;
        case PPAtomMulAssign:          return EHTokMulAssign;
        case PPAtomDivAssign:          return EHTokDivAssign;
        case PPAtomModAssign:          return EHTokModAssign;

        case PpAtomRight:              return EHTokRightOp;
        case PpAtomLeft:               return EHTokLeftOp;

        case PpAtomRightAssign:        return EHTokRightAssign;
        case PpAtomLeftAssign:         return EHTokLeftAssign;
        case PpAtomAndAssign:          return EHTokAndAssign;
        case PpAtomOrAssign:           return EHTokOrAssign;
        case PpAtomXorAssign:          return EHTokXorAssign;

        case PpAtomAnd:                return EHTokAndOp;
        case PpAtomOr:                 return EHTokOrOp;
        case PpAtomXor:                return EHTokXorOp;

        case PpAtomEQ:                 return EHTokEqOp;
        case PpAtomGE:                 return EHTokGeOp;
        case PpAtomNE:                 return EHTokNeOp;
        case PpAtomLE:                 return EHTokLeOp;

        case PpAtomDecrement:          return EHTokDecOp;
        case PpAtomIncrement:          return EHTokIncOp;

        case PpAtomColonColon:         return EHTokColonColon;

        case PpAtomConstInt:           parserToken->i = ppToken.ival;       return EHTokIntConstant;
        case PpAtomConstUint:          parserToken->i = ppToken.ival;       return EHTokUintConstant;
        case PpAtomConstFloat16:       parserToken->d = ppToken.dval;       return EHTokFloat16Constant;
        case PpAtomConstFloat:         parserToken->d = ppToken.dval;       return EHTokFloatConstant;
        case PpAtomConstDouble:        parserToken->d = ppToken.dval;       return EHTokDoubleConstant;
        case PpAtomIdentifier:
        {
            EHlslTokenClass token = tokenizeIdentifier();
            return token;
        }

        case PpAtomConstString: {
            parserToken->string = NewPoolTString(tokenText);
            return EHTokStringConstant;
        }

        case EndOfInput:               return EHTokNone;

        default:
            if (token < PpAtomMaxSingle) {
                char buf[2];
                buf[0] = (char)token;
                buf[1] = 0;
                parseContext.error(loc, "unexpected token", buf, "");
            } else if (tokenText[0] != 0)
                parseContext.error(loc, "unexpected token", tokenText, "");
            else
                parseContext.error(loc, "unexpected token", "", "");
            break;
        }
    } while (true);
}